

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O2

void __thiscall TreeNode::addElement(TreeNode *this,QString *filepath,VCFilterFile *allInfo)

{
  TreeNode *pTVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  long in_FS_OFFSET;
  TreeNode *n;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (filepath->d).d;
  local_48.ptr = (filepath->d).ptr;
  local_48.size = (filepath->d).size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar5 = pathIndex(this,filepath);
  if (iVar5 != -1) {
    QString::left((QString *)&local_68,filepath,(long)iVar5);
    qVar4 = local_48.size;
    pcVar3 = local_48.ptr;
    pDVar2 = local_48.d;
    local_48.d = local_68.d;
    local_48.ptr = local_68.ptr;
    local_68.d = pDVar2;
    local_68.ptr = pcVar3;
    local_48.size = local_68.size;
    local_68.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  local_68.d = (Data *)0x0;
  n = QMap<QString,_TreeNode_*>::value(&this->children,(QString *)&local_48,(TreeNode **)&local_68);
  if (n == (TreeNode *)0x0) {
    n = (TreeNode *)operator_new(0x30);
    (n->super_Node)._vptr_Node = (_func_int **)&PTR__TreeNode_00268c08;
    (n->info).excludeFromBuild = false;
    (n->info).file.d.d = (Data *)0x0;
    (n->info).file.d.ptr = (char16_t *)0x0;
    (n->info).file.d.size = 0;
    (n->children).d.d.ptr =
         (QMapData<std::map<QString,_TreeNode_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_TreeNode_*>_>_>_>
          *)0x0;
    VCFilterFile::operator=(&n->info,allInfo);
    QMap<QString,_TreeNode_*>::insert(&this->children,(QString *)&local_48,&n);
  }
  pTVar1 = n;
  if (iVar5 != -1) {
    QString::mid((longlong)&local_68,(longlong)filepath);
    (*(pTVar1->super_Node)._vptr_Node[2])(pTVar1,&local_68,allInfo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addElement(const QString &filepath, const VCFilterFile &allInfo) override {
        QString newNodeName(filepath);

        int index = pathIndex(filepath);
        if (index != -1)
            newNodeName = filepath.left(index);

        TreeNode *n = children.value(newNodeName);
        if (!n) {
            n = new TreeNode;
            n->info = allInfo;
            children.insert(newNodeName, n);
        }
        if (index != -1)
            n->addElement(filepath.mid(index+1), allInfo);
    }